

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout_p.h
# Opt level: O2

QDockAreaLayout * __thiscall
QDockAreaLayout::operator=(QDockAreaLayout *this,QDockAreaLayout *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QLayoutItem *pQVar3;
  QMainWindow *pQVar4;
  Representation RVar5;
  Representation RVar6;
  Representation RVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  Representation RVar11;
  long lVar12;
  
  uVar1 = *(undefined8 *)param_1->corners;
  uVar2 = *(undefined8 *)(param_1->corners + 2);
  RVar8.m_i = (param_1->rect).x1.m_i;
  RVar9.m_i = (param_1->rect).y1.m_i;
  RVar10.m_i = (param_1->rect).x2.m_i;
  RVar11.m_i = (param_1->rect).y2.m_i;
  pQVar3 = param_1->centralWidgetItem;
  pQVar4 = param_1->mainWindow;
  RVar5.m_i = (param_1->centralWidgetRect).y1.m_i;
  RVar6.m_i = (param_1->centralWidgetRect).x2.m_i;
  RVar7.m_i = (param_1->centralWidgetRect).y2.m_i;
  (this->centralWidgetRect).x1 = (Representation)(param_1->centralWidgetRect).x1.m_i;
  (this->centralWidgetRect).y1 = (Representation)RVar5.m_i;
  (this->centralWidgetRect).x2 = (Representation)RVar6.m_i;
  (this->centralWidgetRect).y2 = (Representation)RVar7.m_i;
  this->centralWidgetItem = pQVar3;
  this->mainWindow = pQVar4;
  (this->rect).x1 = (Representation)RVar8.m_i;
  (this->rect).y1 = (Representation)RVar9.m_i;
  (this->rect).x2 = (Representation)RVar10.m_i;
  (this->rect).y2 = (Representation)RVar11.m_i;
  *(undefined8 *)this->corners = uVar1;
  *(undefined8 *)(this->corners + 2) = uVar2;
  for (lVar12 = 0x40; lVar12 != 0x200; lVar12 = lVar12 + 0x70) {
    QDockAreaLayoutInfo::operator=
              ((QDockAreaLayoutInfo *)((long)this->corners + lVar12),
               (QDockAreaLayoutInfo *)((long)param_1->corners + lVar12));
  }
  this->fallbackToSizeHints = param_1->fallbackToSizeHints;
  this->sep = param_1->sep;
  QArrayDataPointer<QWidget_*>::operator=
            (&(this->separatorWidgets).d,&(param_1->separatorWidgets).d);
  return this;
}

Assistant:

class Q_AUTOTEST_EXPORT QDockAreaLayout
{
public:
    enum { EmptyDropAreaSize = 80 }; // when a dock area is empty, how "wide" is it?

    Qt::DockWidgetArea corners[4]; // use a Qt::Corner for indexing
    QRect rect;
    QLayoutItem *centralWidgetItem;
    QMainWindow *mainWindow;
    QRect centralWidgetRect;
    QDockAreaLayout(QMainWindow *win);
    QDockAreaLayoutInfo docks[4];
    int sep; // margin between a dock widget and its frame
    bool fallbackToSizeHints; //determines if we should use the sizehint for the dock areas (true until the layout is restored or the separator is moved by user)
    mutable QList<QWidget *> separatorWidgets;

    bool isValid() const;

    enum { DockWidgetStateMarker = 0xfd, FloatingDockWidgetTabMarker = 0xf9 };
    static QRect constrainedRect(QRect rect, QWidget *widget);
    void saveState(QDataStream &stream) const;
    bool restoreState(QDataStream &stream, const QList<QDockWidget*> &widgets, bool testing = false);

    QList<int> indexOfPlaceHolder(const QString &objectName) const;
    QList<int> indexOf(const QWidget *dockWidget) const;
    QList<int> gapIndex(const QPoint &pos, bool disallowTabs) const;
    QList<int> findSeparator(const QPoint &pos) const;

    QDockAreaLayoutItem &item(const QList<int> &path);
    QDockAreaLayoutInfo *info(const QList<int> &path);
    const QDockAreaLayoutInfo *info(const QList<int> &path) const;
    QDockAreaLayoutInfo *info(QWidget *widget);
    QRect itemRect(const QList<int> &path) const;
    QRect separatorRect(int index) const;
    QRect separatorRect(const QList<int> &path) const;

    bool insertGap(const QList<int> &path, QLayoutItem *dockWidgetItem);
    QLayoutItem *plug(const QList<int> &path);
    QLayoutItem *unplug(const QList<int> &path);
    void remove(const QList<int> &path);
    void removePlaceHolder(const QString &name);

    void fitLayout();

    void clear();

    QSize sizeHint() const;
    QSize minimumSize() const;
    QSize minimumStableSize() const;
    template<typename SizePMF, typename CenterPMF>
    QSize size_helper(SizePMF sizeFn, CenterPMF centerFn) const;

    void addDockWidget(QInternal::DockPosition pos, QDockWidget *dockWidget, Qt::Orientation orientation);
    bool restoreDockWidget(QDockWidget *dockWidget);
    void splitDockWidget(QDockWidget *after, QDockWidget *dockWidget,
                         Qt::Orientation orientation);
#if QT_CONFIG(tabbar)
    void tabifyDockWidget(QDockWidget *first, QDockWidget *second);
#endif
    void resizeDocks(const QList<QDockWidget *> &docks, const QList<int> &sizes, Qt::Orientation o);

    void apply(bool animate);

    void paintSeparators(QPainter *p, QWidget *widget, const QRegion &clip,
                            const QPoint &mouse) const;
    QRegion separatorRegion() const;
    int separatorMove(const QList<int> &separator, const QPoint &origin, const QPoint &dest);
#if QT_CONFIG(tabbar)
    void updateSeparatorWidgets() const;
#endif // QT_CONFIG(tabbar)

    QLayoutItem *itemAt(int *x, int index) const;
    QLayoutItem *takeAt(int *x, int index);
    void deleteAllLayoutItems();

    void getGrid(QList<QLayoutStruct> *ver_struct_list, QList<QLayoutStruct> *hor_struct_list);
    void setGrid(QList<QLayoutStruct> *ver_struct_list, QList<QLayoutStruct> *hor_struct_list);

    QRect gapRect(const QList<int> &path) const;
    QRect gapRect(QInternal::DockPosition dockPos) const;

    void keepSize(QDockWidget *w);
#if QT_CONFIG(tabbar)
    QSet<QTabBar*> usedTabBars() const;
    QSet<QWidget*> usedSeparatorWidgets() const;
#endif // QT_CONFIG(tabbar)
    void styleChangedEvent();
}